

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O1

bool __thiscall libwebm::VpxPesParser::ReadPacketLength(VpxPesParser *this,uint16_t *packet_length)

{
  ushort uVar1;
  
  if (packet_length != (uint16_t *)0x0) {
    if (5 < (*(int *)(this + 0x60) - (int)*(long *)(this + 0x70)) - (int)*(long *)(this + 0x58)) {
      uVar1 = *(ushort *)(*(long *)(this + 0x58) + 4 + *(long *)(this + 0x70));
      *packet_length = uVar1 << 8 | uVar1 >> 8;
      return true;
    }
  }
  return false;
}

Assistant:

bool VpxPesParser::ReadPacketLength(std::uint16_t* packet_length) const {
  if (!packet_length || BytesAvailable() < 6)
    return false;

  // Read and byte swap 16 bit big endian length.
  *packet_length =
      (pes_file_data_[read_pos_ + 4] << 8) | pes_file_data_[read_pos_ + 5];

  return true;
}